

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::DefaultSampling<tcu::Matrix<float,_2,_3>_>::genFixeds
          (DefaultSampling<tcu::Matrix<float,_2,_3>_> *this,FloatFormat *fmt,
          vector<tcu::Matrix<float,_2,_3>,_std::allocator<tcu::Matrix<float,_2,_3>_>_> *dst)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  float *pfVar4;
  long lVar5;
  ulong uVar6;
  float fVar7;
  vector<float,_std::allocator<float>_> scalars;
  vector<float,_std::allocator<float>_> local_58;
  Vector<float,_2> local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  DefaultSampling<float>::genFixeds((DefaultSampling<float> *)this,fmt,&local_58);
  if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar6 = 0;
    do {
      local_38.m_data[0] = 0.0;
      local_38.m_data[1] = 0.0;
      uStack_30 = 0;
      local_28 = 0;
      lVar3 = 0;
      pfVar4 = local_38.m_data;
      bVar1 = true;
      do {
        bVar2 = bVar1;
        lVar5 = 0;
        do {
          if (lVar3 == lVar5) {
            fVar7 = local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar6];
          }
          else {
            fVar7 = 0.0;
          }
          pfVar4[lVar5 * 2] = fVar7;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        lVar3 = 1;
        pfVar4 = local_38.m_data + 1;
        bVar1 = false;
      } while (bVar2);
      std::vector<tcu::Matrix<float,2,3>,std::allocator<tcu::Matrix<float,2,3>>>::
      emplace_back<tcu::Matrix<float,2,3>>
                ((vector<tcu::Matrix<float,2,3>,std::allocator<tcu::Matrix<float,2,3>>> *)dst,
                 (Matrix<float,_2,_3> *)&local_38);
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)local_58.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_58.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void	genFixeds	(const FloatFormat& fmt, vector<Value>& dst) const
	{
		vector<T> scalars;

		instance<DefaultSampling<T> >().genFixeds(fmt, scalars);

		for (size_t scalarNdx = 0; scalarNdx < scalars.size(); ++scalarNdx)
			dst.push_back(Value(scalars[scalarNdx]));

		if (Columns == Rows)
		{
			Value	mat	(0.0);
			T		x	= T(1.0f);
			mat[0][0] = x;
			for (int ndx = 0; ndx < Columns; ++ndx)
			{
				mat[Columns-1-ndx][ndx] = x;
				x *= T(2.0f);
			}
			dst.push_back(mat);
		}
	}